

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

UnblindParameter * __thiscall
cfd::core::ConfidentialTransaction::UnblindTxOut
          (UnblindParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_out_index,Privkey *blinding_key)

{
  UnblindParameter *__return_storage_ptr___00;
  _func_int **__dest;
  size_t sVar1;
  pointer puVar2;
  CfdException *this_00;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  ConfidentialTxOut tx_out;
  ByteData local_208;
  uint32_t local_1ec;
  ConfidentialNonce local_1e8;
  undefined1 local_1c0 [32];
  byte local_1a0;
  UnblindParameter *local_188;
  ConfidentialValue local_180;
  ConfidentialAssetId local_158;
  Privkey *local_130;
  ConfidentialTxOut local_128;
  
  local_1ec = tx_out_index;
  local_130 = blinding_key;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,(ulong)tx_out_index,0xb46,"UnblindTxOut");
  ConfidentialTxOut::ConfidentialTxOut
            (&local_128,
             (this->vout_).
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_start + tx_out_index);
  ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_1c0,&local_128.asset_);
  bVar5 = true;
  local_188 = __return_storage_ptr__;
  if (1 < local_1a0) {
    ConfidentialNonce::ConfidentialNonce(&local_1e8,&local_128.nonce_);
    bVar5 = true;
    if (1 < local_1e8.version_) {
      ConfidentialValue::ConfidentialValue(&local_180,&local_128.confidential_value_);
      bVar5 = true;
      if (1 < local_180.version_) {
        local_158._vptr_ConfidentialAssetId = (_func_int **)0x0;
        local_158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar3 = (long)local_128.range_proof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_128.range_proof_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
        if (uVar3 == 0) {
          __dest = (_func_int **)0x0;
          sVar4 = 0;
        }
        else {
          if ((long)uVar3 < 0) {
            ::std::__throw_bad_alloc();
          }
          __dest = (_func_int **)operator_new(uVar3);
          sVar4 = (long)local_128.range_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_128.range_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
        }
        local_158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar3 + (long)__dest);
        local_158._vptr_ConfidentialAssetId = __dest;
        if (local_128.range_proof_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_128.range_proof_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          local_158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)__dest;
          memmove(__dest,local_128.range_proof_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,sVar4);
        }
        local_158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)((long)__dest + sVar4);
        sVar1 = ByteData::GetDataSize((ByteData *)&local_158);
        if (sVar1 == 0) {
          bVar5 = true;
        }
        else {
          local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          uVar3 = (long)local_128.surjection_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_128.surjection_proof_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
          if (uVar3 == 0) {
            puVar2 = (pointer)0x0;
            sVar4 = 0;
          }
          else {
            if ((long)uVar3 < 0) {
              ::std::__throw_bad_alloc();
            }
            puVar2 = (pointer)operator_new(uVar3);
            sVar4 = (long)local_128.surjection_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_128.surjection_proof_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
          }
          local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = puVar2 + uVar3;
          local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = puVar2;
          if (local_128.surjection_proof_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_128.surjection_proof_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish = puVar2;
            memmove(puVar2,local_128.surjection_proof_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,sVar4);
          }
          local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar2 + sVar4;
          sVar1 = ByteData::GetDataSize(&local_208);
          bVar5 = sVar1 == 0;
          if (local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_208.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_158._vptr_ConfidentialAssetId != (_func_int **)0x0) {
          operator_delete(local_158._vptr_ConfidentialAssetId);
        }
      }
      local_180._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
      if (local_180.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_180.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    local_1e8._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00723710;
    if (local_1e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  local_1c0._0_8_ = &PTR__ConfidentialAssetId_00723760;
  if ((void *)CONCAT44(local_1c0._12_4_,local_1c0._8_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_1c0._12_4_,local_1c0._8_4_));
  }
  if (!bVar5) {
    ConfidentialNonce::ConfidentialNonce(&local_1e8,&local_128.nonce_);
    local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar3 = (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar3 == 0) {
      puVar2 = (pointer)0x0;
      sVar4 = 0;
    }
    else {
      if ((long)uVar3 < 0) {
        ::std::__throw_bad_alloc();
      }
      puVar2 = (pointer)operator_new(uVar3);
      sVar4 = (long)local_128.range_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_128.range_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar2 + uVar3;
    local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar2;
    if (local_128.range_proof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_128.range_proof_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
      memmove(puVar2,local_128.range_proof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,sVar4);
    }
    local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2 + sVar4;
    ConfidentialValue::ConfidentialValue(&local_180,&local_128.confidential_value_);
    __return_storage_ptr___00 = local_188;
    AbstractTxOut::GetLockingScript((Script *)local_1c0,&local_128.super_AbstractTxOut);
    ConfidentialAssetId::ConfidentialAssetId(&local_158,&local_128.asset_);
    CalculateUnblindData
              (__return_storage_ptr___00,&local_1e8,local_130,&local_208,&local_180,
               (Script *)local_1c0,&local_158);
    local_158._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
    if (local_158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Script::~Script((Script *)local_1c0);
    local_180._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
    if (local_180.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_208.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_208.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1e8._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_00723710;
    if (local_1e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1c0._0_8_ = &PTR__ConfidentialNonce_00723710;
    ByteData::ByteData((ByteData *)(local_1c0 + 8));
    local_1a0 = '\0';
    ByteData::ByteData((ByteData *)&local_1e8);
    ByteData::ByteData((ByteData *)&local_180);
    SetTxOutCommitment(this,tx_out_index,&__return_storage_ptr___00->asset,
                       &__return_storage_ptr___00->value,(ConfidentialNonce *)local_1c0,
                       (ByteData *)&local_1e8,(ByteData *)&local_180);
    if (local_180._vptr_ConfidentialValue != (_func_int **)0x0) {
      operator_delete(local_180._vptr_ConfidentialValue);
    }
    if (local_1e8._vptr_ConfidentialNonce != (_func_int **)0x0) {
      operator_delete(local_1e8._vptr_ConfidentialNonce);
    }
    local_1c0._0_8_ = &PTR__ConfidentialNonce_00723710;
    if ((void *)CONCAT44(local_1c0._12_4_,local_1c0._8_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_1c0._12_4_,local_1c0._8_4_));
    }
    ConfidentialTxOut::~ConfidentialTxOut(&local_128);
    return __return_storage_ptr___00;
  }
  local_1c0._0_8_ = "cfdcore_elements_transaction.cpp";
  local_1c0._8_4_ = 0xb4e;
  local_1c0._16_8_ = (long)"CfdUnblindTxOut" + 3;
  logger::log<unsigned_int&>
            ((CfdSourceLocation *)local_1c0,kCfdLogLevelWarning,
             "Failed to unblind TxOut. Target TxOut already unblinded.: tx_out_index=[{}]",
             &local_1ec);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_1c0._0_8_ = local_1c0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,"Failed to unblind TxOut. Target TxOut already unblinded.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_1c0);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::UnblindTxOut(
    uint32_t tx_out_index, const Privkey &blinding_key) {
  CheckTxOutIndex(tx_out_index, __LINE__, __FUNCTION__);

  ConfidentialTxOut tx_out(vout_[tx_out_index]);
  if (!tx_out.GetAsset().HasBlinding() || !tx_out.GetNonce().HasBlinding() ||
      !tx_out.GetConfidentialValue().HasBlinding() ||
      (tx_out.GetRangeProof().GetDataSize() == 0) ||
      (tx_out.GetSurjectionProof().GetDataSize() == 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to unblind TxOut. Target TxOut already unblinded.: "
        "tx_out_index=[{}]",
        tx_out_index);
    throw CfdException(
        kCfdIllegalStateError,
        "Failed to unblind TxOut. Target TxOut already unblinded.");
  }

  UnblindParameter result = CalculateUnblindData(
      tx_out.GetNonce(), blinding_key, tx_out.GetRangeProof(),
      tx_out.GetConfidentialValue(), tx_out.GetLockingScript(),
      tx_out.GetAsset());

  // clear and set unblind value to txout
  SetTxOutCommitment(
      tx_out_index, result.asset, result.value, ConfidentialNonce(),
      ByteData(), ByteData());

  return result;
}